

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void check_integral_opt_get<int,zmq::sockopt::integral_option<13,int,true>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  StringRef macroName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e8;
  SourceLineInfo local_c8;
  MessageBuilder local_b8;
  ScopedMessage scopedMessage19;
  
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
  local_c8.line = 0xf2;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_b8,macroName,&local_c8,Info);
  std::operator+(&bStack_e8,"getting ",param_2);
  std::operator<<(local_b8.super_MessageStream.m_stream.m_oss,(string *)&bStack_e8);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage19,&local_b8);
  std::__cxx11::string::~string((string *)&bStack_e8);
  Catch::MessageBuilder::~MessageBuilder(&local_b8);
  zmq::detail::socket_base::get<13,int,true>(param_1);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage19);
  return;
}

Assistant:

void check_integral_opt_get(Opt opt, zmq::socket_t &sock, std::string info)
{
    INFO("getting " + info);
    (void) sock.get(opt);
}